

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::Comment(cmXMLWriter *this,char *comment)

{
  ostream *poVar1;
  size_t sVar2;
  
  CloseStartElement(this);
  ConditionalLineBreak
            (this,(bool)(this->IsContent ^ 1),
             (long)(this->Elements).c.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Elements).c.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  poVar1 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!-- ",5);
  if (comment == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(comment);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,comment,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -->",4);
  return;
}

Assistant:

void cmXMLWriter::Comment(const char* comment)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent, this->Elements.size());
  this->Output << "<!-- " << comment << " -->";
}